

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

mpack_error_t mpack_tree_destroy(mpack_tree_t *tree)

{
  mpack_tree_page_t *pmVar1;
  mpack_tree_page_t *__ptr;
  
  __ptr = tree->next;
  while (__ptr != (mpack_tree_page_t *)0x0) {
    pmVar1 = __ptr->next;
    free(__ptr);
    __ptr = pmVar1;
  }
  tree->next = (mpack_tree_page_t *)0x0;
  if (tree->buffer != (char *)0x0) {
    free(tree->buffer);
  }
  if (tree->teardown != (mpack_tree_teardown_t)0x0) {
    (*tree->teardown)(tree);
  }
  tree->teardown = (mpack_tree_teardown_t)0x0;
  return tree->error;
}

Assistant:

mpack_error_t mpack_tree_destroy(mpack_tree_t* tree) {
    mpack_tree_cleanup(tree);

    #ifdef MPACK_MALLOC
    if (tree->buffer)
        MPACK_FREE(tree->buffer);
    #endif

    if (tree->teardown)
        tree->teardown(tree);
    tree->teardown = NULL;

    return tree->error;
}